

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.h
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaANCF_3843::GetSubBlockOffset(ChElementHexaANCF_3843 *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return m_nodes[nblock]->NodeGetOffset_w(); }